

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O0

bool deqp::gles3::Functional::verifyTexCompareResult<tcu::Texture2DArray>
               (TestContext *testCtx,ConstPixelBufferAccess *result,Texture2DArray *src,
               float *texCoord,ReferenceParams *sampleParams,TexComparePrecision *comparePrec,
               LodPrecision *lodPrec,PixelFormat *pixelFormat)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TestLog *this;
  TextureFormat *format;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  Texture2DArrayView TVar6;
  allocator<char> local_6e1;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  LogImage local_698;
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  LogImage local_5b8;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  LogImage local_4d8;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  LogImageSet local_3f8;
  MessageBuilder local_3b8;
  Texture2DArrayView local_238;
  PixelBufferAccess local_228;
  ConstPixelBufferAccess local_200;
  Texture2DArrayView local_1d8;
  SurfaceAccess local_1c8;
  Texture2DArrayView local_1a8;
  PixelBufferAccess local_198;
  ConstPixelBufferAccess local_170;
  Texture2DArrayView local_148;
  SurfaceAccess local_138;
  undefined1 local_118 [8];
  Texture2DArray clampedSource;
  int numFailedPixels;
  IVec4 local_a8;
  tcu local_98 [16];
  undefined1 local_88 [8];
  Vec3 nonShadowThreshold;
  undefined1 local_70 [8];
  Surface errorMask;
  Surface reference;
  TestLog *log;
  TexComparePrecision *comparePrec_local;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  Texture2DArray *src_local;
  ConstPixelBufferAccess *result_local;
  TestContext *testCtx_local;
  
  this = tcu::TestContext::getLog(testCtx);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar2,iVar3);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Surface::Surface((Surface *)local_70,iVar2,iVar3);
  glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&stack0xffffffffffffff48,pixelFormat);
  tcu::operator-((tcu *)&local_a8,(Vector<int,_4> *)&stack0xffffffffffffff48,1);
  tcu::computeFixedPointThreshold(local_98,&local_a8);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_88,(int)local_98,1,2);
  format = tcu::TextureLevelPyramid::getFormat(&src->super_TextureLevelPyramid);
  bVar1 = isFloatingPointDepthFormat(format);
  if (bVar1) {
    tcu::Texture2DArray::Texture2DArray((Texture2DArray *)local_118,src);
    clampFloatingPointTexture((Texture2DArray *)local_118);
    tcu::SurfaceAccess::SurfaceAccess(&local_138,(Surface *)&errorMask.m_pixels.m_cap,pixelFormat);
    TVar6 = tcu::Texture2DArray::operator_cast_to_Texture2DArrayView((Texture2DArray *)local_118);
    local_148.m_levels = TVar6.m_levels;
    local_148.m_numLevels = TVar6.m_numLevels;
    glu::TextureTestUtil::sampleTexture(&local_138,&local_148,texCoord,sampleParams);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_170,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::Surface::getAccess(&local_198,(Surface *)local_70);
    TVar6 = tcu::Texture2DArray::operator_cast_to_Texture2DArrayView((Texture2DArray *)local_118);
    local_1a8.m_levels = TVar6.m_levels;
    local_1a8.m_numLevels = TVar6.m_numLevels;
    clampedSource.m_view.m_levels._4_4_ =
         glu::TextureTestUtil::computeTextureCompareDiff
                   (result,&local_170,&local_198,&local_1a8,texCoord,sampleParams,comparePrec,
                    lodPrec,(Vec3 *)local_88);
    tcu::Texture2DArray::~Texture2DArray((Texture2DArray *)local_118);
  }
  else {
    tcu::SurfaceAccess::SurfaceAccess(&local_1c8,(Surface *)&errorMask.m_pixels.m_cap,pixelFormat);
    TVar6 = tcu::Texture2DArray::operator_cast_to_Texture2DArrayView(src);
    local_1d8.m_levels = TVar6.m_levels;
    local_1d8.m_numLevels = TVar6.m_numLevels;
    glu::TextureTestUtil::sampleTexture(&local_1c8,&local_1d8,texCoord,sampleParams);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_200,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::Surface::getAccess(&local_228,(Surface *)local_70);
    TVar6 = tcu::Texture2DArray::operator_cast_to_Texture2DArrayView(src);
    local_238.m_levels = TVar6.m_levels;
    local_238.m_numLevels = TVar6.m_numLevels;
    clampedSource.m_view.m_levels._4_4_ =
         glu::TextureTestUtil::computeTextureCompareDiff
                   (result,&local_200,&local_228,&local_238,texCoord,sampleParams,comparePrec,
                    lodPrec,(Vec3 *)local_88);
  }
  if (0 < clampedSource.m_view.m_levels._4_4_) {
    tcu::TestLog::operator<<(&local_3b8,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_3b8,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(int *)((long)&clampedSource.m_view.m_levels + 4));
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"VerifyResult",&local_419)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Verification result",&local_441);
  tcu::LogImageSet::LogImageSet(&local_3f8,&local_418,&local_440);
  pTVar5 = tcu::TestLog::operator<<(this,&local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"Rendered",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"Rendered image",&local_521);
  tcu::LogImage::LogImage(&local_4d8,&local_4f8,&local_520,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_4d8);
  tcu::LogImage::~LogImage(&local_4d8);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  tcu::LogImageSet::~LogImageSet(&local_3f8);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  if (0 < clampedSource.m_view.m_levels._4_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"Reference",&local_5d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"Ideal reference image",&local_601);
    tcu::LogImage::LogImage
              (&local_5b8,&local_5d8,&local_600,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = tcu::TestLog::operator<<(this,&local_5b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"ErrorMask",&local_6b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"Error mask",&local_6e1)
    ;
    tcu::LogImage::LogImage
              (&local_698,&local_6b8,&local_6e0,(Surface *)local_70,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar5,&local_698);
    tcu::LogImage::~LogImage(&local_698);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator(&local_6e1);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator(&local_6b9);
    tcu::LogImage::~LogImage(&local_5b8);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
  }
  tcu::TestLog::operator<<(this,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar1 = clampedSource.m_view.m_levels._4_4_ == 0;
  tcu::Surface::~Surface((Surface *)local_70);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  return bVar1;
}

Assistant:

bool verifyTexCompareResult (tcu::TestContext&						testCtx,
							 const tcu::ConstPixelBufferAccess&		result,
							 const TextureType&						src,
							 const float*							texCoord,
							 const ReferenceParams&					sampleParams,
							 const tcu::TexComparePrecision&		comparePrec,
							 const tcu::LodPrecision&				lodPrec,
							 const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log					= testCtx.getLog();
	tcu::Surface	reference			(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask			(result.getWidth(), result.getHeight());
	const tcu::Vec3	nonShadowThreshold	= tcu::computeFixedPointThreshold(getBitsVec(pixelFormat)-1).swizzle(1,2,3);
	int				numFailedPixels;

	// sampleTexture() expects source image to be the same state as it would be in a GL implementation, that is
	// the floating point depth values should be in [0, 1] range as data is clamped during texture upload. Since
	// we don't have a separate "uploading" phase and just reuse the buffer we used for GL-upload, do the clamping
	// here if necessary.

	if (isFloatingPointDepthFormat(src.getFormat()))
	{
		TextureType clampedSource(src);

		clampFloatingPointTexture(clampedSource);

		// sample clamped values

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), clampedSource, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), clampedSource, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}
	else
	{
		// sample raw values (they are guaranteed to be in [0, 1] range as the format cannot represent any other values)

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}

	if (numFailedPixels > 0)
		log << TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("Reference", "Ideal reference image", reference)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return numFailedPixels == 0;
}